

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O2

int transport_worker_thread(void *threadArgument)

{
  LOCK_RESULT LVar1;
  size_t sVar2;
  undefined8 *puVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  char *pcVar6;
  size_t index;
  
  do {
    LVar1 = Lock(*(LOCK_HANDLE *)((long)threadArgument + 0x10));
    if (LVar1 == LOCK_OK) {
      if (*(int *)((long)threadArgument + 0x18) != 0) {
        Unlock(*(LOCK_HANDLE *)((long)threadArgument + 0x10));
        ThreadAPI_Exit(0);
        return 0;
      }
      (**(code **)((long)threadArgument + 0x98))(*threadArgument);
      Unlock(*(LOCK_HANDLE *)((long)threadArgument + 0x10));
    }
    LVar1 = Lock(*(LOCK_HANDLE *)((long)threadArgument + 0xe0));
    if (LVar1 == LOCK_OK) {
      sVar2 = VECTOR_size(*(VECTOR_HANDLE *)((long)threadArgument + 0xd8));
      for (index = 0; sVar2 != index; index = index + 1) {
        puVar3 = (undefined8 *)VECTOR_element(*(VECTOR_HANDLE *)((long)threadArgument + 0xd8),index)
        ;
        if (puVar3 != (undefined8 *)0x0) {
          (**(code **)((long)threadArgument + 0xe8))(*puVar3);
        }
      }
      LVar1 = Unlock(*(LOCK_HANDLE *)((long)threadArgument + 0xe0));
      if (LVar1 != LOCK_OK) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          iVar5 = 0xa1;
          pcVar6 = "failed to unlock on multiplexed_client_do_work";
          goto LAB_00124b9d;
        }
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar5 = 0x8d;
        pcVar6 = "failed to lock for multiplexed_client_do_work";
LAB_00124b9d:
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                  ,"multiplexed_client_do_work",iVar5,1,pcVar6);
      }
    }
    ThreadAPI_Sleep(1);
  } while( true );
}

Assistant:

static int transport_worker_thread(void* threadArgument)
{
    TRANSPORT_HANDLE_DATA* transportData = (TRANSPORT_HANDLE_DATA*)threadArgument;

    while (1)
    {
        if (Lock(transportData->lockHandle) == LOCK_OK)
        {
            if (transportData->stopThread)
            {
                (void)Unlock(transportData->lockHandle);
                break;
            }
            else
            {
                (transportData->IoTHubTransport_DoWork)(transportData->transportLLHandle);

                (void)Unlock(transportData->lockHandle);
            }
        }

        multiplexed_client_do_work(transportData);

        ThreadAPI_Sleep(1);
    }

    ThreadAPI_Exit(0);
    return 0;
}